

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O0

void __thiscall
gss::TimedRestartsSchedule::TimedRestartsSchedule
          (TimedRestartsSchedule *this,milliseconds d,unsigned_long_long m)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  _func_int **in_RDX;
  _func_int **in_RSI;
  RestartsSchedule *in_RDI;
  duration<long,_std::ratio<1L,_1000L>_> *__rhs;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc8;
  
  RestartsSchedule::RestartsSchedule(in_RDI);
  in_RDI->_vptr_RestartsSchedule = (_func_int **)&PTR__TimedRestartsSchedule_001fb880;
  in_RDI[1]._vptr_RestartsSchedule = (_func_int **)0x0;
  in_RDI[2]._vptr_RestartsSchedule = in_RDX;
  in_RDI[3]._vptr_RestartsSchedule = in_RSI;
  __rhs = (duration<long,_std::ratio<1L,_1000L>_> *)(in_RDI + 4);
  std::chrono::_V2::steady_clock::now();
  tVar1 = std::chrono::operator+(in_stack_ffffffffffffffc8,__rhs);
  __rhs->__r = (rep)tVar1.__d.__r;
  return;
}

Assistant:

TimedRestartsSchedule::TimedRestartsSchedule(milliseconds d, unsigned long long m) :
    _number_of_backtracks(0),
    _minimum_backtracks(m),
    _duration(d),
    _next_restart_point(steady_clock::now() + d)
{
}